

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

FT_Pointer
ft_mem_realloc(FT_Memory memory,FT_Long item_size,FT_Long cur_count,FT_Long new_count,void *block,
              FT_Error *p_error)

{
  int iVar1;
  uint in_EAX;
  FT_Pointer pvVar2;
  FT_Error error;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  pvVar2 = ft_mem_qrealloc(memory,item_size,cur_count,new_count,block,
                           (FT_Error *)((long)&uStack_38 + 4));
  iVar1 = uStack_38._4_4_;
  if ((new_count - cur_count != 0 && cur_count <= new_count) && uStack_38._4_4_ == 0) {
    memset((void *)((long)pvVar2 + cur_count * item_size),0,(new_count - cur_count) * item_size);
  }
  *p_error = iVar1;
  return pvVar2;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_realloc( FT_Memory  memory,
                  FT_Long    item_size,
                  FT_Long    cur_count,
                  FT_Long    new_count,
                  void*      block,
                  FT_Error  *p_error )
  {
    FT_Error  error = FT_Err_Ok;


    block = ft_mem_qrealloc( memory, item_size,
                             cur_count, new_count, block, &error );
    if ( !error && new_count > cur_count )
      FT_MEM_ZERO( (char*)block + cur_count * item_size,
                   ( new_count - cur_count ) * item_size );

    *p_error = error;
    return block;
  }